

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> * __thiscall
cfd::core::Psbt::GetGlobalXpubkeyDataList
          (vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *__return_storage_ptr__,
          Psbt *this)

{
  void *pvVar1;
  size_type __n;
  ulong uVar2;
  CfdException *this_00;
  undefined8 *puVar3;
  ulong uVar4;
  size_type sVar5;
  value_type_conflict2 *__x;
  ByteData fingerprint;
  vector<unsigned_int,_std::allocator<unsigned_int>_> path;
  ByteData key;
  ExtPubkey ext_pubkey;
  KeyData local_180;
  
  pvVar1 = this->wally_psbt_pointer_;
  if (pvVar1 != (void *)0x0) {
    __n = *(size_type *)((long)pvVar1 + 0x48);
    (__return_storage_ptr__->
    super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::reserve
              (__return_storage_ptr__,__n);
    for (sVar5 = 0; sVar5 != __n; sVar5 = sVar5 + 1) {
      if (*(long *)(*(long *)((long)pvVar1 + 0x40) + 8 + sVar5 * 0x20) == 0x4f) {
        puVar3 = (undefined8 *)(*(long *)((long)pvVar1 + 0x40) + sVar5 * 0x20);
        if (*(char *)*puVar3 == '\x01') {
          ByteData::ByteData(&key,(uint8_t *)((char *)*puVar3 + 1),0x4e);
          ExtPubkey::ExtPubkey(&ext_pubkey,&key);
          ByteData::ByteData(&fingerprint);
          path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          if (puVar3[3] != 0 && (puVar3[3] & 3) == 0) {
            ByteData::ByteData((ByteData *)&local_180,(uint8_t *)puVar3[2],4);
            ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
                      (&fingerprint.data_,&local_180);
            ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                      ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_180);
            __x = (value_type_conflict2 *)puVar3[2];
            uVar2 = puVar3[3];
            for (uVar4 = 1; __x = __x + 1, uVar4 < uVar2 >> 2; uVar4 = uVar4 + 1) {
              ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,__x);
            }
          }
          KeyData::KeyData(&local_180,&ext_pubkey,
                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           &path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>,
                           &fingerprint);
          ::std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::
          emplace_back<cfd::core::KeyData>(__return_storage_ptr__,&local_180);
          KeyData::~KeyData(&local_180);
          ::std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    (&path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&fingerprint);
          ExtPubkey::~ExtPubkey(&ext_pubkey);
          ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&key);
        }
      }
    }
    return __return_storage_ptr__;
  }
  local_180.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = "cfdcore_psbt.cpp";
  local_180.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish._0_4_ = 0xc9f;
  local_180.pubkey_.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = "GetGlobalXpubkeyDataList";
  logger::warn<>((CfdSourceLocation *)&local_180,"psbt pointer is null");
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  ::std::__cxx11::string::string
            ((string *)&local_180,"psbt pointer is null.",(allocator *)&ext_pubkey);
  CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)&local_180);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

std::vector<KeyData> Psbt::GetGlobalXpubkeyDataList() const {
  struct wally_psbt *psbt_pointer;
  psbt_pointer = static_cast<struct wally_psbt *>(wally_psbt_pointer_);
  if (psbt_pointer == nullptr) {
    warn(CFD_LOG_SOURCE, "psbt pointer is null");
    throw CfdException(kCfdIllegalStateError, "psbt pointer is null.");
  }

  size_t key_max = psbt_pointer->unknowns.num_items;
  std::vector<KeyData> arr;
  arr.reserve(key_max);
  struct wally_map_item *item;
  for (size_t key_index = 0; key_index < key_max; ++key_index) {
    item = &psbt_pointer->unknowns.items[key_index];
    if (item->key_len != kPsbtGlobalXpubSize) continue;
    if (item->key[0] != Psbt::kPsbtGlobalXpub) continue;
    ByteData key(&item->key[1], static_cast<uint32_t>(item->key_len) - 1);
    ExtPubkey ext_pubkey(key);

    ByteData fingerprint;
    std::vector<uint32_t> path;
    if (((item->value_len % 4) == 0) && (item->value_len > 0)) {
      fingerprint = ByteData(item->value, 4);

      // TODO(k-matsuzawa) Need endian support.
      size_t arr_max = item->value_len / 4;
      uint32_t *val_arr = reinterpret_cast<uint32_t *>(item->value);
      for (size_t arr_index = 1; arr_index < arr_max; ++arr_index) {
        path.push_back(val_arr[arr_index]);
      }
    }
    arr.emplace_back(KeyData(ext_pubkey, path, fingerprint));
  }
  return arr;
}